

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * OpToStr_abi_cxx11_(string *__return_storage_ptr__,int op)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(op) {
  case 1:
    __s = "+";
    __a = &local_9;
    break;
  case 2:
    __s = "-";
    __a = &local_a;
    break;
  case 3:
    __s = "*";
    __a = &local_b;
    break;
  case 4:
    __s = "/";
    __a = &local_c;
    break;
  case 5:
    __s = "^";
    __a = &local_12;
    break;
  case 6:
    __s = "exp";
    __a = &local_11;
    break;
  case 7:
    __s = "log";
    __a = &local_13;
    break;
  default:
    __s = "nil";
    __a = &local_14;
    break;
  case 9:
    __s = "sin";
    __a = &local_e;
    break;
  case 10:
    __s = "cos";
    __a = &local_d;
    break;
  case 0xb:
    __s = "tan";
    __a = &local_f;
    break;
  case 0xc:
    __s = "cot";
    __a = &local_10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string OpToStr(int op)
{
    switch (op) {
    case ADD:
        return "+";
    case SUB:
        return "-";
    case MUL:
        return "*";
    case DIV:
        return "/";
    case COS:
        return "cos";
    case SIN:
        return "sin";
    case TAN:
        return "tan";
    case COT:
        return "cot";
    case EXP:
        return "exp";
    case PWR:
        return "^";
    case LOG:
        return "log";
    default:
        return "nil";
    }
}